

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void fixjump(FuncState *fs,int pc,int dest)

{
  Instruction *pIVar1;
  
  if (~pc + dest + 0xffffffU < 0x2000000) {
    pIVar1 = fs->f->code;
    pIVar1[pc] = (~pc + dest) * 0x80 + (pIVar1[pc] & 0x7f) + 0x7fffff80;
    return;
  }
  luaX_syntaxerror(fs->ls,"control structure too long");
}

Assistant:

static void fixjump (FuncState *fs, int pc, int dest) {
  Instruction *jmp = &fs->f->code[pc];
  int offset = dest - (pc + 1);
  lua_assert(dest != NO_JUMP);
  if (!(-OFFSET_sJ <= offset && offset <= MAXARG_sJ - OFFSET_sJ))
    luaX_syntaxerror(fs->ls, "control structure too long");
  lua_assert(GET_OPCODE(*jmp) == OP_JMP);
  SETARG_sJ(*jmp, offset);
}